

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrapper.cpp
# Opt level: O2

UniquePtr<SDL_Surface> * __thiscall
solitaire::SDL::Wrapper::loadBMP
          (UniquePtr<SDL_Surface> *__return_storage_ptr__,Wrapper *this,string *file)

{
  undefined8 uVar1;
  pointer __p;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  uVar1 = SDL_RWFromFile((file->_M_dataplus)._M_p,"rb");
  __p = (pointer)SDL_LoadBMP_RW(uVar1,1);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::_Function_handler<void_(SDL_Surface_*),_solitaire::SDL::PtrDeleter>::_M_invoke;
  local_28 = std::_Function_handler<void_(SDL_Surface_*),_solitaire::SDL::PtrDeleter>::_M_manager;
  std::__uniq_ptr_impl<SDL_Surface,std::function<void(SDL_Surface*)>>::
  __uniq_ptr_impl<std::function<void(SDL_Surface*)>>
            ((__uniq_ptr_impl<SDL_Surface,std::function<void(SDL_Surface*)>> *)
             __return_storage_ptr__,__p,(function<void_(SDL_Surface_*)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Surface> Wrapper::loadBMP(const std::string& file) const {
    return UniquePtr<SDL_Surface> {SDL_LoadBMP(file.c_str()), PtrDeleter {}};
}